

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O2

void __thiscall CVmObjGramProd::mark_alt_refs(CVmObjGramProd *this,vmgram_alt_info *alt,uint state)

{
  anon_union_24_5_d4664839_for_typinfo *paVar1;
  ulong uVar2;
  
  if (alt->proc_obj != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,alt->proc_obj,state);
  }
  paVar1 = &alt->toks->typinfo;
  for (uVar2 = 0; uVar2 < alt->tok_cnt; uVar2 = uVar2 + 1) {
    if ((*(uchar *)((long)paVar1 + -6) == '\x01') && (paVar1->prod_obj != 0)) {
      CVmObjTable::add_to_gc_queue(&G_obj_table_X,paVar1->prod_obj,state);
    }
    paVar1 = (anon_union_24_5_d4664839_for_typinfo *)((long)paVar1 + 0x20);
  }
  return;
}

Assistant:

void CVmObjGramProd::mark_alt_refs(VMG_ const vmgram_alt_info *alt, uint state)
{
    /* mark the match object */
    if (alt->proc_obj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(alt->proc_obj, state);

    /* run through the token list */
    vmgram_tok_info *tok = alt->toks;
    for (size_t j = 0 ; j < alt->tok_cnt ; ++j, ++tok)
    {
        /* only production matches have object references */
        if (tok->typ == VMGRAM_MATCH_PROD
            && tok->typinfo.prod_obj != VM_INVALID_OBJ)
        {
            /* mark the reference */
            G_obj_table->mark_all_refs(tok->typinfo.prod_obj, state);
        }
    }
}